

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shunting_yard.cpp
# Opt level: O1

Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
infix_to_postfix(Queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *__return_storage_ptr__,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *infix)

{
  int iVar1;
  pointer pcVar2;
  bool bVar3;
  int *piVar4;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> stack;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  operators;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  string local_108;
  string local_e8;
  int *local_c8;
  pointer local_c0;
  pointer local_b8;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_b0;
  string local_70;
  string local_50;
  
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::BPlusTree(&local_b0,false);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"OR","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"AND","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,">","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,">=","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"<","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"<=","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"=","");
  piVar4 = Map::
           Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)&local_b0,&local_148);
  *piVar4 = 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  local_128._size = 0;
  local_128._data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  local_128._data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_data =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  __return_storage_ptr__->_data_back =
       (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)0x0
  ;
  pbVar6 = (infix->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_c0 = (infix->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != local_c0) {
    local_c8 = &__return_storage_ptr__->_size;
    local_110 = &local_108.field_2;
    do {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      local_b8 = pbVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar2,pcVar2 + pbVar6->_M_string_length);
      string_util::uppercase(&local_e8,&local_148);
      bVar3 = Map::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              ::contains((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                          *)&local_b0,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (bVar3) {
        while( true ) {
          if (local_128._size == 0) {
            bVar3 = false;
          }
          else {
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
            pcVar2 = ((local_128._data)->_item)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_108,pcVar2,
                       pcVar2 + ((local_128._data)->_item)._M_string_length);
            string_util::uppercase(&local_50,&local_108);
            piVar4 = Map::
                     Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                   *)&local_b0,&local_50);
            iVar1 = *piVar4;
            string_util::uppercase(&local_70,&local_148);
            piVar4 = Map::
                     Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                   *)&local_b0,&local_70);
            bVar3 = *piVar4 <= iVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p);
            }
          }
          if (!bVar3) break;
          List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          pop_front(&local_e8,&local_128);
          pNVar5 = LinkedList::insert_after<std::__cxx11::string>
                             (&__return_storage_ptr__->_data,__return_storage_ptr__->_data_back,
                              &local_e8);
          __return_storage_ptr__->_data_back = pNVar5;
          __return_storage_ptr__->_size = __return_storage_ptr__->_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        LinkedList::insert_head<std::__cxx11::string>(&local_128._data,&local_148);
        piVar4 = &local_128._size;
        if (local_128._data_back ==
            (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          local_128._data_back = local_128._data;
          piVar4 = &local_128._size;
        }
      }
      else {
        pNVar5 = LinkedList::insert_after<std::__cxx11::string>
                           (&__return_storage_ptr__->_data,__return_storage_ptr__->_data_back,
                            &local_148);
        __return_storage_ptr__->_data_back = pNVar5;
        piVar4 = local_c8;
      }
      *piVar4 = *piVar4 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      pbVar6 = local_b8 + 1;
    } while (pbVar6 != local_c0);
  }
  if (local_128._size != 0) {
    do {
      List<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pop_front(&local_148,&local_128);
      pNVar5 = LinkedList::insert_after<std::__cxx11::string>
                         (&__return_storage_ptr__->_data,__return_storage_ptr__->_data_back,
                          &local_148);
      __return_storage_ptr__->_data_back = pNVar5;
      __return_storage_ptr__->_size = __return_storage_ptr__->_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
    } while (local_128._size != 0);
  }
  LinkedList::delete_all<std::__cxx11::string>(&local_128._data);
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~BPlusTree(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

Queue<std::string> infix_to_postfix(const std::vector<std::string>& infix) {
    // operator -> precedence
    Map::Map<std::string, int> operators;
    operators["OR"] = 0;
    operators["AND"] = 1;
    operators[">"] = 2;
    operators[">="] = 2;
    operators["<"] = 2;
    operators["<="] = 2;
    operators["="] = 2;

    Stack<std::string> stack;
    Queue<std::string> queue;
    for (auto token : infix) {
        if (!operators.contains(string_util::uppercase(token)))
            queue.push(token);
        else {
            while (!stack.empty() &&
                   operators[string_util::uppercase(stack.top())] >=
                       operators[string_util::uppercase(token)]) {
                queue.push(stack.pop());
            }
            stack.push(token);
        }
    }
    while (!stack.empty()) {
        queue.push(stack.pop());
    }
    #ifdef DEBUG
        std::cout << queue << '\n';
    #endif
    return queue;
}